

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

LOCK_HANDLE IoTHubTransport_GetLock(TRANSPORT_HANDLE transportHandle)

{
  TRANSPORT_HANDLE_DATA *transportData;
  LOCK_HANDLE lock;
  TRANSPORT_HANDLE transportHandle_local;
  
  if (transportHandle == (TRANSPORT_HANDLE)0x0) {
    transportData = (TRANSPORT_HANDLE_DATA *)0x0;
  }
  else {
    transportData = (TRANSPORT_HANDLE_DATA *)transportHandle->lockHandle;
  }
  return transportData;
}

Assistant:

LOCK_HANDLE IoTHubTransport_GetLock(TRANSPORT_HANDLE transportHandle)
{
    LOCK_HANDLE lock;
    if (transportHandle == NULL)
    {
        lock = NULL;
    }
    else
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;
        lock = transportData->lockHandle;
    }
    return lock;
}